

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::DTDScanner::scanEnumeration
          (DTDScanner *this,DTDAttDef *attDef,XMLBuffer *toFill,bool notation)

{
  XMLBufferMgr *this_00;
  ReaderMgr *pRVar1;
  XMLCh *chars;
  XMLScanner *this_01;
  bool bVar2;
  int iVar3;
  XMLBuffer *toFill_00;
  XMLSize_t XVar4;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  XMLBufBid bbTmp;
  
  toFill->fIndex = 0;
  checkForPERef(this,false,true);
  if ((int)CONCAT71(in_register_00000009,notation) != 0) {
    bVar2 = ReaderMgr::skippedChar(this->fReaderMgr,L'(');
    if (!bVar2) {
      XMLScanner::emitError(this->fScanner,ExpectedOpenParen);
    }
  }
  this_00 = this->fBufMgr;
  toFill_00 = XMLBufferMgr::bidOnBuffer(this_00);
  while( true ) {
    checkForPERef(this,false,true);
    pRVar1 = this->fReaderMgr;
    toFill_00->fIndex = 0;
    bVar2 = XMLReader::getName(pRVar1->fCurReader,toFill_00,!notation);
    if (!bVar2) {
      this_01 = this->fScanner;
      iVar3 = (*(attDef->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])(attDef);
      bVar2 = false;
      XMLScanner::emitError
                (this_01,ExpectedEnumValue,(XMLCh *)CONCAT44(extraout_var,iVar3),(XMLCh *)0x0,
                 (XMLCh *)0x0,(XMLCh *)0x0);
      goto LAB_00301006;
    }
    XVar4 = toFill_00->fIndex;
    chars = toFill_00->fBuffer;
    chars[XVar4] = L'\0';
    XMLBuffer::append(toFill,chars,XVar4);
    checkForPERef(this,false,true);
    bVar2 = ReaderMgr::skippedChar(this->fReaderMgr,L')');
    if (bVar2) break;
    XVar4 = toFill->fIndex;
    if (XVar4 == toFill->fCapacity) {
      XMLBuffer::ensureCapacity(toFill,1);
      XVar4 = toFill->fIndex;
    }
    toFill->fIndex = XVar4 + 1;
    toFill->fBuffer[XVar4] = L' ';
    bVar2 = ReaderMgr::skippedChar(this->fReaderMgr,L'|');
    if (!bVar2) {
      XMLScanner::emitError(this->fScanner,ExpectedEnumSepOrParen);
      bVar2 = false;
LAB_00301006:
      XMLBufferMgr::releaseBuffer(this_00,toFill_00);
      return bVar2;
    }
  }
  bVar2 = true;
  goto LAB_00301006;
}

Assistant:

bool DTDScanner::scanEnumeration( const   DTDAttDef&  attDef
                                    ,       XMLBuffer&  toFill
                                    , const bool        notation)
{
    // Reset the passed buffer
    toFill.reset();

    // Check for PE ref but don't require space
    checkForPERef(false, true);

    // If this is a notation, we need an opening paren
    if (notation)
    {
        if (!fReaderMgr->skippedChar(chOpenParen))
            fScanner->emitError(XMLErrs::ExpectedOpenParen);
    }

    // We need a local buffer to use as well
    XMLBufBid bbTmp(fBufMgr);

    while (true)
    {
        // Space is allowed here for either type so check for PE ref
        checkForPERef(false, true);

        // And then get either a name or a name token
        bool success;
        if (notation)
            success = fReaderMgr->getName(bbTmp.getBuffer());
        else
            success = fReaderMgr->getNameToken(bbTmp.getBuffer());

        if (!success)
        {
            fScanner->emitError
            (
                XMLErrs::ExpectedEnumValue
                , attDef.getFullName()
            );
            return false;
        }

        // Append this value to the target value
        toFill.append(bbTmp.getRawBuffer(), bbTmp.getLen());

        // Space is allowed here for either type so check for PE ref
        checkForPERef(false, true);

        // Check for the terminating paren
        if (fReaderMgr->skippedChar(chCloseParen))
            break;

        // And append a space separator
        toFill.append(chSpace);

        // Check for the pipe character separator
        if (!fReaderMgr->skippedChar(chPipe))
        {
            fScanner->emitError(XMLErrs::ExpectedEnumSepOrParen);
            return false;
        }
    }
    return true;
}